

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

format_arg * __thiscall
fmt::v5::
basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::do_get(format_arg *__return_storage_ptr__,
        basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *this,size_type index)

{
  format_arg *pfVar1;
  ulong uVar2;
  size_t sVar3;
  longlong lVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  
  uVar7 = this->types_;
  if (-1 < (long)uVar7) {
    (__return_storage_ptr__->value_).field_0.int_value = 0;
    __return_storage_ptr__->type_ = none_type;
    if ((index < 0x10) &&
       (uVar7 = uVar7 >> ((char)index * '\x04' & 0x3fU),
       __return_storage_ptr__->type_ = (type)uVar7 & (pointer_type|uint_type), (uVar7 & 0xf) != 0))
    {
      sVar3 = (this->field_1).values_[index].field_0.string.size;
      (__return_storage_ptr__->value_).field_0.long_long_value =
           (this->field_1).values_[index].field_0.long_long_value;
      (__return_storage_ptr__->value_).field_0.string.size = sVar3;
    }
    return __return_storage_ptr__;
  }
  uVar2 = (ulong)index;
  if (uVar2 < -uVar7) {
    pfVar1 = (this->field_1).args_ + uVar2;
    lVar4 = (pfVar1->value_).field_0.long_long_value;
    sVar3 = (pfVar1->value_).field_0.string.size;
    pfVar1 = (this->field_1).args_ + uVar2;
    uVar6 = *(undefined4 *)&pfVar1->field_0x14;
    uVar5 = *(undefined8 *)(&pfVar1->type_ + 2);
    __return_storage_ptr__->type_ = pfVar1->type_;
    *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar6;
    *(undefined8 *)&__return_storage_ptr__->field_0x18 = uVar5;
    (__return_storage_ptr__->value_).field_0.long_long_value = lVar4;
    (__return_storage_ptr__->value_).field_0.string.size = sVar3;
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->value_).field_0.int_value = 0;
  __return_storage_ptr__->type_ = none_type;
  return __return_storage_ptr__;
}

Assistant:

format_arg do_get(size_type index) const {
    long long signed_types = static_cast<long long>(types_);
    if (signed_types < 0) {
      unsigned long long num_args = static_cast<unsigned long long>(-signed_types);
      return index < num_args ? args_[index] : format_arg();
    }
    format_arg arg;
    if (index > internal::max_packed_args)
      return arg;
    arg.type_ = type(index);
    if (arg.type_ == internal::none_type)
      return arg;
    internal::value<Context> &val = arg.value_;
    val = values_[index];
    return arg;
  }